

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>>,float,float>
               (Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
                *dst,CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
                     *src,assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
  *src_local;
  Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false> *dst_local
  ;
  
  IVar1 = CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>
          ::rows(src);
  cols = CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>
         ::cols(src);
  IVar2 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
          ::rows((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                  *)dst);
  if (IVar2 == IVar1) {
    IVar2 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
            ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                    *)dst);
    if (IVar2 == cols) goto LAB_001dda6d;
  }
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>
  ::resize((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
            *)dst,IVar1,cols);
LAB_001dda6d:
  IVar2 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
          ::rows((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                  *)dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
            ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                    *)dst);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 1, -1, true>, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, 1, -1>>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}